

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Header.cpp
# Opt level: O2

string * short_name_abi_cxx11_(string *__return_storage_ptr__,Encoding *encoding)

{
  allocator<char> *__a;
  char *__s;
  allocator<char> local_14;
  allocator<char> local_13;
  allocator<char> local_12;
  allocator<char> local_11;
  allocator<char> local_10;
  allocator<char> local_f;
  allocator<char> local_e;
  allocator<char> local_d;
  allocator<char> local_c;
  allocator<char> local_b;
  allocator<char> local_a;
  allocator<char> local_9;
  
  switch(*encoding) {
  case MFM:
    __s = "mfm";
    __a = &local_9;
    break;
  case FM:
    __s = "fm";
    __a = &local_a;
    break;
  case RX02:
    __s = "rx";
    __a = &local_b;
    break;
  case Amiga:
    __s = "ami";
    __a = &local_c;
    break;
  case GCR:
    __s = "gcr";
    __a = &local_d;
    break;
  case Ace:
    __s = "ace";
    __a = &local_e;
    break;
  case MX:
    __s = "mx";
    __a = &local_f;
    break;
  case Agat:
    __s = "agat";
    __a = &local_10;
    break;
  case Apple:
    __s = "a2";
    __a = &local_11;
    break;
  case Victor:
    __s = "vic";
    __a = &local_12;
    break;
  case Vista:
    __s = "vis";
    __a = &local_13;
    break;
  default:
    __s = "unk";
    __a = &local_14;
  }
  std::__cxx11::string::string<std::allocator<char>>((string *)__return_storage_ptr__,__s,__a);
  return __return_storage_ptr__;
}

Assistant:

std::string short_name(const Encoding& encoding)
{
    switch (encoding)
    {
    case Encoding::MFM:     return "mfm";           break;
    case Encoding::FM:      return "fm";            break;
    case Encoding::RX02:    return "rx";            break;
    case Encoding::Amiga:   return "ami";           break;
    case Encoding::GCR:     return "gcr";           break;
    case Encoding::Ace:     return "ace";           break;
    case Encoding::MX:      return "mx";            break;
    case Encoding::Agat:    return "agat";          break;
    case Encoding::Apple:   return "a2";            break;
    case Encoding::Victor:  return "vic";           break;
    case Encoding::Vista:   return "vis";           break;
    case Encoding::Unknown: break;
    }
    return "unk";
}